

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Bool poolGrow(STRING_POOL *pool)

{
  block *pbVar1;
  int iVar2;
  int iVar3;
  BLOCK *pBVar4;
  XML_Char *pXVar5;
  ulong uVar6;
  XML_Char *pXVar7;
  size_t sVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  
  pBVar4 = pool->freeBlocks;
  if (pBVar4 == (BLOCK *)0x0) {
LAB_004eaadc:
    pBVar4 = pool->blocks;
    iVar2 = (int)pool->start;
    iVar9 = (int)pool->end;
    if (pool->start == pBVar4->s && pBVar4 != (BLOCK *)0x0) {
      iVar3 = 0;
      uVar10 = (iVar9 - iVar2) * 2;
      if ((int)uVar10 < 0) goto LAB_004eac42;
      iVar2 = uVar10 + 0xc;
      if ((int)(uVar10 + 0xc) < 1) {
        iVar2 = iVar3;
      }
      if (iVar2 == 0 || uVar10 == 0) goto LAB_004eac42;
      pBVar4 = (BLOCK *)(*pool->mem->realloc_fcn)(pBVar4,(size_t)iVar2);
      if (pBVar4 != (BLOCK *)0x0) {
        pool->blocks = pBVar4;
        pBVar4->size = uVar10;
        pool->ptr = pool->ptr + (long)pBVar4 + (0xc - (long)pool->start);
        pool->start = pBVar4->s;
        uVar6 = (ulong)uVar10;
        goto LAB_004eab61;
      }
    }
    else {
      uVar10 = iVar9 - iVar2;
      if ((-1 < (int)uVar10) &&
         ((uVar11 = 0x400, uVar10 < 0x400 || (uVar11 = uVar10 * 2, -1 < (int)uVar11)))) {
        iVar3 = 0;
        iVar2 = uVar11 + 0xc;
        if ((int)(uVar11 + 0xc) < 1) {
          iVar2 = 0;
        }
        if (iVar2 == 0) goto LAB_004eac42;
        pBVar4 = (BLOCK *)(*pool->mem->malloc_fcn)((size_t)iVar2);
        if (pBVar4 != (BLOCK *)0x0) {
          pBVar4->size = uVar11;
          pBVar4->next = pool->blocks;
          pool->blocks = pBVar4;
          pXVar5 = pool->ptr;
          sVar8 = (long)pXVar5 - (long)pool->start;
          pXVar7 = pXVar5;
          if (sVar8 != 0) {
            memcpy(pBVar4->s,pool->start,sVar8);
            pXVar7 = pool->ptr;
            pXVar5 = pool->start;
          }
          pool->ptr = pXVar7 + (0xc - (long)pXVar5) + (long)(pBVar4->s + -0xc);
          pool->start = pBVar4->s;
          pXVar5 = pBVar4->s + ((ulong)uVar11 - 0xc);
          goto LAB_004eab68;
        }
      }
    }
    iVar3 = 0;
  }
  else {
    pXVar5 = pool->start;
    if (pXVar5 == (XML_Char *)0x0) {
      pool->blocks = pBVar4;
      pool->freeBlocks = pBVar4->next;
      pBVar4->next = (block *)0x0;
      pool->start = pBVar4->s;
      pool->end = pBVar4->s + pBVar4->size;
      pool->ptr = pBVar4->s;
    }
    else {
      sVar8 = (long)pool->end - (long)pXVar5;
      if ((long)pBVar4->size <= (long)sVar8) goto LAB_004eaadc;
      pbVar1 = pBVar4->next;
      pBVar4->next = pool->blocks;
      pool->blocks = pBVar4;
      pool->freeBlocks = pbVar1;
      memcpy(pBVar4->s,pXVar5,sVar8);
      pBVar4 = pool->blocks;
      pool->ptr = pool->ptr + (long)pBVar4 + (0xc - (long)pool->start);
      pool->start = pBVar4->s;
      uVar6 = (ulong)pBVar4->size;
LAB_004eab61:
      pXVar5 = pBVar4->s + (uVar6 - 0xc);
LAB_004eab68:
      pool->end = pXVar5 + 0xc;
    }
    iVar3 = 1;
  }
LAB_004eac42:
  return (XML_Bool)iVar3;
}

Assistant:

static XML_Bool FASTCALL
poolGrow(STRING_POOL *pool)
{
  if (pool->freeBlocks) {
    if (pool->start == 0) {
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = pool->freeBlocks->next;
      pool->blocks->next = NULL;
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      pool->ptr = pool->start;
      return XML_TRUE;
    }
    if (pool->end - pool->start < pool->freeBlocks->size) {
      BLOCK *tem = pool->freeBlocks->next;
      pool->freeBlocks->next = pool->blocks;
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = tem;
      memcpy(pool->blocks->s, pool->start,
             (pool->end - pool->start) * sizeof(XML_Char));
      pool->ptr = pool->blocks->s + (pool->ptr - pool->start);
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      return XML_TRUE;
    }
  }
  if (pool->blocks && pool->start == pool->blocks->s) {
    BLOCK *temp;
    int blockSize = (int)((unsigned)(pool->end - pool->start)*2U);
    size_t bytesToAllocate;

    if (blockSize < 0)
      return XML_FALSE;

    bytesToAllocate = poolBytesToAllocateFor(blockSize);
    if (bytesToAllocate == 0)
      return XML_FALSE;

    temp = (BLOCK *)
      pool->mem->realloc_fcn(pool->blocks, (unsigned)bytesToAllocate);
    if (temp == NULL)
      return XML_FALSE;
    pool->blocks = temp;
    pool->blocks->size = blockSize;
    pool->ptr = pool->blocks->s + (pool->ptr - pool->start);
    pool->start = pool->blocks->s;
    pool->end = pool->start + blockSize;
  }
  else {
    BLOCK *tem;
    int blockSize = (int)(pool->end - pool->start);
    size_t bytesToAllocate;

    if (blockSize < 0)
      return XML_FALSE;

    if (blockSize < INIT_BLOCK_SIZE)
      blockSize = INIT_BLOCK_SIZE;
    else {
      /* Detect overflow, avoiding _signed_ overflow undefined behavior */
      if ((int)((unsigned)blockSize * 2U) < 0) {
        return XML_FALSE;
      }
      blockSize *= 2;
    }

    bytesToAllocate = poolBytesToAllocateFor(blockSize);
    if (bytesToAllocate == 0)
      return XML_FALSE;

    tem = (BLOCK *)pool->mem->malloc_fcn(bytesToAllocate);
    if (!tem)
      return XML_FALSE;
    tem->size = blockSize;
    tem->next = pool->blocks;
    pool->blocks = tem;
    if (pool->ptr != pool->start)
      memcpy(tem->s, pool->start,
             (pool->ptr - pool->start) * sizeof(XML_Char));
    pool->ptr = tem->s + (pool->ptr - pool->start);
    pool->start = tem->s;
    pool->end = tem->s + blockSize;
  }
  return XML_TRUE;
}